

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::Recover(DBImpl *this,VersionEdit *edit,bool *save_manifest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *dbname;
  long *plVar1;
  pointer ppVar2;
  DB DVar3;
  unsigned_long *puVar4;
  iterator iVar5;
  char cVar6;
  bool bVar7;
  VersionEdit *in_RCX;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  FileType type;
  SequenceNumber max_sequence;
  char buf [50];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  uint64_t number;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> expected;
  DB local_168;
  DBImpl *local_160;
  unsigned_long *local_158;
  iterator iStack_150;
  unsigned_long *local_148;
  FileType local_13c;
  VersionEdit *local_138;
  _Alloc_hider local_130;
  undefined1 local_128 [72];
  Comparator *pCStack_e0;
  size_t local_d8;
  Writer *local_c8;
  Writer *local_c0;
  WritableFile *local_b8;
  Writer *local_b0;
  undefined1 local_a8 [8];
  Version *local_a0;
  Version *local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  Compressor *local_80;
  Compressor *local_78;
  undefined1 local_70 [32];
  Slice local_50;
  Slice local_40;
  
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  dbname = &edit[0xd].comparator_.field_2;
  local_138 = in_RCX;
  local_b8 = (WritableFile *)save_manifest;
  (**(code **)(*plVar1 + 0x48))(&local_78,plVar1,dbname);
  if (local_78 != (Compressor *)0x0) {
    operator_delete__(local_78);
  }
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  LockFileName((string *)local_128,(string *)dbname);
  (**(code **)(*plVar1 + 0x68))(&local_168,plVar1,(string *)local_128,&edit[0xd].last_sequence_);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if (local_168._vptr_DB == (_func_int **)0x0) {
    plVar1 = (long *)(edit->comparator_)._M_string_length;
    local_160 = this;
    CurrentFileName((string *)local_128,(string *)dbname);
    cVar6 = (**(code **)(*plVar1 + 0x30))(plVar1,(string *)local_128);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    this = local_160;
    if (cVar6 == '\0') {
      if ((char)edit->last_sequence_ == '\x01') {
        NewDB((DBImpl *)local_128);
        DVar3._vptr_DB = local_168._vptr_DB;
        local_168._vptr_DB = (_func_int **)local_128._0_8_;
        local_128._0_8_ = DVar3._vptr_DB;
        if (DVar3._vptr_DB != (_func_int **)0x0) {
          operator_delete__(DVar3._vptr_DB);
        }
        this = local_160;
        if (local_168._vptr_DB == (_func_int **)0x0) goto LAB_0010a50e;
        goto LAB_0010a423;
      }
      local_128._0_8_ = edit[0xd].comparator_.field_2._M_allocated_capacity;
      local_128._8_8_ = *(size_type *)((long)&edit[0xd].comparator_.field_2 + 8);
      local_a8 = (undefined1  [8])0x12467a;
      local_a0 = (Version *)0x2b;
LAB_0010a60f:
      Status::Status((Status *)local_160,kInvalidArgument,(Slice *)local_128,(Slice *)local_a8);
    }
    else {
      if (*(char *)((long)&edit->last_sequence_ + 1) == '\x01') {
        local_128._0_8_ = edit[0xd].comparator_.field_2._M_allocated_capacity;
        local_128._8_8_ = *(size_type *)((long)&edit[0xd].comparator_.field_2 + 8);
        local_a8 = (undefined1  [8])0x1246a6;
        local_a0 = (Version *)0x20;
        goto LAB_0010a60f;
      }
LAB_0010a50e:
      VersionSet::Recover((VersionSet *)local_128,
                          (bool *)edit[0xf].compact_pointers_.
                                  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      DVar3._vptr_DB = local_168._vptr_DB;
      local_168._vptr_DB = (_func_int **)local_128._0_8_;
      local_128._0_8_ = DVar3._vptr_DB;
      if (DVar3._vptr_DB != (_func_int **)0x0) {
        operator_delete__(DVar3._vptr_DB);
      }
      this = local_160;
      if (local_168._vptr_DB != (_func_int **)0x0) goto LAB_0010a423;
      local_130._M_p = (pointer)0x0;
      ppVar2 = edit[0xf].compact_pointers_.
               super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_c0 = (Writer *)ppVar2[2].second.rep_._M_string_length;
      local_c8 = (Writer *)ppVar2[2].second.rep_.field_2._M_allocated_capacity;
      local_d8 = 0;
      local_128._64_8_ = (Comparator *)0x0;
      pCStack_e0 = (Comparator *)0x0;
      plVar1 = (long *)(edit->comparator_)._M_string_length;
      (**(code **)(*plVar1 + 0x38))(local_128,plVar1,dbname);
      DVar3._vptr_DB = local_168._vptr_DB;
      local_168._vptr_DB = (_func_int **)local_128._0_8_;
      local_128._0_8_ = DVar3._vptr_DB;
      if (DVar3._vptr_DB != (_func_int **)0x0) {
        operator_delete__(DVar3._vptr_DB);
      }
      if (local_168._vptr_DB == (_func_int **)0x0) {
        local_90 = (_Base_ptr)&local_a0;
        local_a0 = (Version *)((ulong)local_a0 & 0xffffffff00000000);
        local_98 = (Version *)0x0;
        local_80 = (Compressor *)0x0;
        local_88 = local_90;
        VersionSet::AddLiveFiles
                  ((VersionSet *)
                   edit[0xf].compact_pointers_.
                   super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   local_a8);
        local_148 = (unsigned_long *)0x0;
        local_158 = (unsigned_long *)0x0;
        iStack_150._M_current = (unsigned_long *)0x0;
        if (pCStack_e0 != (Comparator *)local_128._64_8_) {
          lVar8 = 0;
          uVar9 = 0;
          do {
            bVar7 = ParseFileName((string *)((long)(_func_int ***)local_128._64_8_ + lVar8),
                                  (uint64_t *)&local_b0,&local_13c);
            if (bVar7) {
              pVar11 = std::
                       _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                      *)local_a8,(key_type *)&local_b0);
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)local_a8,(_Base_ptr)pVar11.first._M_node,
                             (_Base_ptr)pVar11.second._M_node);
              if ((local_13c == kLogFile) && ((local_c0 <= local_b0 || (local_b0 == local_c8)))) {
                if (iStack_150._M_current == local_148) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_158,
                             iStack_150,(unsigned_long *)&local_b0);
                }
                else {
                  *iStack_150._M_current = (unsigned_long)local_b0;
                  iStack_150._M_current = iStack_150._M_current + 1;
                }
              }
            }
            uVar9 = uVar9 + 1;
            lVar8 = lVar8 + 0x20;
          } while (uVar9 < (ulong)((long)pCStack_e0 - local_128._64_8_ >> 5));
        }
        iVar5._M_current = iStack_150._M_current;
        puVar4 = local_158;
        if (local_80 == (Compressor *)0x0) {
          if (local_158 != iStack_150._M_current) {
            uVar9 = (long)iStack_150._M_current - (long)local_158 >> 3;
            lVar8 = 0x3f;
            if (uVar9 != 0) {
              for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_158,iStack_150._M_current,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar4,iVar5._M_current);
            if ((long)iStack_150._M_current - (long)local_158 != 0) {
              uVar9 = (long)iStack_150._M_current - (long)local_158 >> 3;
              uVar10 = 0;
              do {
                RecoverLogFile((DBImpl *)local_128,(uint64_t)edit,SUB81(local_158[uVar10],0),
                               (bool *)(ulong)(uVar10 == uVar9 - 1),local_138,
                               (SequenceNumber *)local_b8);
                DVar3._vptr_DB = local_168._vptr_DB;
                local_168._vptr_DB = (_func_int **)local_128._0_8_;
                local_128._0_8_ = DVar3._vptr_DB;
                if (DVar3._vptr_DB != (_func_int **)0x0) {
                  operator_delete__(DVar3._vptr_DB);
                }
                if (local_168._vptr_DB != (_func_int **)0x0) {
                  (local_160->super_DB)._vptr_DB = local_168._vptr_DB;
                  local_168._vptr_DB = (_func_int **)0x0;
                  goto LAB_0010a8e5;
                }
                VersionSet::MarkFileNumberUsed
                          ((VersionSet *)
                           edit[0xf].compact_pointers_.
                           super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,local_158[uVar10]);
                uVar10 = uVar10 + 1;
                uVar9 = (long)iStack_150._M_current - (long)local_158 >> 3;
              } while (uVar10 < uVar9);
            }
          }
          ppVar2 = edit[0xf].compact_pointers_.
                   super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (ppVar2[2].second.rep_._M_dataplus._M_p < local_130._M_p) {
            ppVar2[2].second.rep_._M_dataplus._M_p = local_130._M_p;
          }
          (local_160->super_DB)._vptr_DB = (_func_int **)0x0;
        }
        else {
          snprintf((char *)local_128,0x32,"%d missing files; e.g.");
          local_40.data_ = (char *)local_128;
          local_40.size_ = strlen((char *)local_128);
          TableFileName((string *)local_70,(string *)dbname,(uint64_t)*(Version **)(local_90 + 1));
          local_50.data_ = (char *)local_70._0_8_;
          local_50.size_ = local_70._8_8_;
          Status::Status((Status *)local_160,kCorruption,&local_40,&local_50);
          if ((Compressor *)local_70._0_8_ != (Compressor *)(local_70 + 0x10)) {
            operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
          }
        }
LAB_0010a8e5:
        this = local_160;
        if (local_158 != (unsigned_long *)0x0) {
          operator_delete(local_158,(long)local_148 - (long)local_158);
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::_M_erase((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)local_a8,(_Link_type)local_98);
      }
      else {
        (this->super_DB)._vptr_DB = local_168._vptr_DB;
        local_168._vptr_DB = (_func_int **)0x0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_128 + 0x40));
    }
    if (local_168._vptr_DB != (_func_int **)0x0) {
      operator_delete__(local_168._vptr_DB);
    }
  }
  else {
LAB_0010a423:
    (this->super_DB)._vptr_DB = local_168._vptr_DB;
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Recover(VersionEdit* edit, bool* save_manifest) {
  mutex_.AssertHeld();

  // Ignore error from CreateDir since the creation of the DB is
  // committed only when the descriptor is created, and this directory
  // may already exist from a previous failed creation attempt.
  env_->CreateDir(dbname_);
  assert(db_lock_ == nullptr);
  Status s = env_->LockFile(LockFileName(dbname_), &db_lock_);
  if (!s.ok()) {
    return s;
  }

  if (!env_->FileExists(CurrentFileName(dbname_))) {
    if (options_.create_if_missing) {
      s = NewDB();
      if (!s.ok()) {
        return s;
      }
    } else {
      return Status::InvalidArgument(
          dbname_, "does not exist (create_if_missing is false)");
    }
  } else {
    if (options_.error_if_exists) {
      return Status::InvalidArgument(dbname_,
                                     "exists (error_if_exists is true)");
    }
  }

  s = versions_->Recover(save_manifest);
  if (!s.ok()) {
    return s;
  }
  SequenceNumber max_sequence(0);

  // Recover from all newer log files than the ones named in the
  // descriptor (new log files may have been added by the previous
  // incarnation without registering them in the descriptor).
  //
  // Note that PrevLogNumber() is no longer used, but we pay
  // attention to it in case we are recovering a database
  // produced by an older version of leveldb.
  const uint64_t min_log = versions_->LogNumber();
  const uint64_t prev_log = versions_->PrevLogNumber();
  std::vector<std::string> filenames;
  s = env_->GetChildren(dbname_, &filenames);
  if (!s.ok()) {
    return s;
  }
  std::set<uint64_t> expected;
  versions_->AddLiveFiles(&expected);
  uint64_t number;
  FileType type;
  std::vector<uint64_t> logs;
  for (size_t i = 0; i < filenames.size(); i++) {
    if (ParseFileName(filenames[i], &number, &type)) {
      expected.erase(number);
      if (type == kLogFile && ((number >= min_log) || (number == prev_log)))
        logs.push_back(number);
    }
  }
  if (!expected.empty()) {
    char buf[50];
    snprintf(buf, sizeof(buf), "%d missing files; e.g.",
             static_cast<int>(expected.size()));
    return Status::Corruption(buf, TableFileName(dbname_, *(expected.begin())));
  }

  // Recover in the order in which the logs were generated
  std::sort(logs.begin(), logs.end());
  for (size_t i = 0; i < logs.size(); i++) {
    s = RecoverLogFile(logs[i], (i == logs.size() - 1), save_manifest, edit,
                       &max_sequence);
    if (!s.ok()) {
      return s;
    }

    // The previous incarnation may not have written any MANIFEST
    // records after allocating this log number.  So we manually
    // update the file number allocation counter in VersionSet.
    versions_->MarkFileNumberUsed(logs[i]);
  }

  if (versions_->LastSequence() < max_sequence) {
    versions_->SetLastSequence(max_sequence);
  }

  return Status::OK();
}